

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

word * Dau_DsdToTruth(char *p,int nVars)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined4 uVar3;
  word wVar4;
  undefined1 auVar5 [16];
  word *pRes;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int __c;
  undefined1 *puVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  char *local_28;
  
  auVar5 = _DAT_00912220;
  uVar6 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar6 = 1;
  }
  if (Dau_DsdTtElems_pTtElems == 0) {
    lVar7 = 1;
    puVar9 = Dau_DsdTtElems_TtElems;
    auVar12 = _DAT_00912210;
    do {
      if (SUB164(auVar12 ^ auVar5,4) == -0x80000000 && SUB164(auVar12 ^ auVar5,0) < -0x7ffffff3) {
        *(undefined1 **)(Dau_DsdTtElems_TtElems + lVar7 * 8 + 0x19f8) = puVar9;
        (&Dau_DsdTtElems_pTtElems)[lVar7] = (long)(puVar9 + 0x200);
      }
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
      lVar7 = lVar7 + 2;
      puVar9 = puVar9 + 0x400;
    } while (lVar7 != 0xf);
    uVar10 = 0;
    do {
      lVar7 = (&Dau_DsdTtElems_pTtElems)[uVar10];
      if (uVar10 < 6) {
        wVar4 = s_Truths6[uVar10];
        uVar3 = *(undefined4 *)((long)s_Truths6 + uVar10 * 8 + 4);
        lVar8 = 0;
        do {
          puVar1 = (undefined4 *)(lVar7 + lVar8 * 8);
          *puVar1 = (int)wVar4;
          puVar1[1] = uVar3;
          puVar1[2] = (int)wVar4;
          puVar1[3] = uVar3;
          lVar8 = lVar8 + 2;
        } while (lVar8 != 0x40);
      }
      else {
        uVar11 = 1 << ((char)uVar10 - 6U & 0x1f);
        lVar8 = 0;
        uVar13 = 0;
        uVar14 = 1;
        do {
          uVar15 = uVar11 & uVar13;
          uVar16 = uVar11 & uVar14;
          puVar2 = (uint *)(lVar7 + lVar8 * 8);
          *puVar2 = -(uint)(uVar15 == 0) ^ 0xffffffff;
          puVar2[1] = -(uint)(uVar15 == 0) ^ 0xffffffff;
          puVar2[2] = -(uint)(uVar16 == 0) ^ 0xffffffff;
          puVar2[3] = -(uint)(uVar16 == 0) ^ 0xffffffff;
          lVar8 = lVar8 + 2;
          uVar13 = uVar13 + 2;
          uVar14 = uVar14 + 2;
        } while (lVar8 != 0x40);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0xc);
  }
  pRes = DAT_00dd8580;
  local_28 = p;
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x266,"word *Dau_DsdToTruth(char *, int)");
  }
  if (*p == '1') {
    if (p[1] != '\0') goto LAB_004df272;
    if ((int)uVar6 < 1) goto LAB_004df2a0;
    __c = 0xff;
  }
  else {
    if ((*p != '0') || (p[1] != '\0')) {
LAB_004df272:
      Dau_DsdComputeMatches(p);
      Dau_DsdToTruth_rec(p,&local_28,Dau_DsdComputeMatches::pMatches,
                         (word **)&Dau_DsdTtElems_pTtElems,pRes,nVars);
      p = local_28;
      goto LAB_004df2a0;
    }
    if ((int)uVar6 < 1) goto LAB_004df2a0;
    __c = 0;
  }
  memset(DAT_00dd8580,__c,uVar6 << 3);
LAB_004df2a0:
  local_28 = p + 1;
  if (p[1] == '\0') {
    return pRes;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                ,0x26d,"word *Dau_DsdToTruth(char *, int)");
}

Assistant:

word * Dau_DsdToTruth( char * p, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    word ** pTtElems = Dau_DsdTtElems();
    word * pRes = pTtElems[DAU_MAX_VAR];
    assert( nVars <= DAU_MAX_VAR );
    if ( Dau_DsdIsConst0(p) )
        Abc_TtConst0( pRes, nWords );
    else if ( Dau_DsdIsConst1(p) )
        Abc_TtConst1( pRes, nWords );
    else
        Dau_DsdToTruth_rec( p, &p, Dau_DsdComputeMatches(p), pTtElems, pRes, nVars );
    assert( *++p == 0 );
    return pRes;
}